

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg.c
# Opt level: O3

int imsg_get_fd(imsgbuf *ibuf)

{
  imsg_fd *__ptr;
  imsgbuf *piVar1;
  imsg_fd **ppiVar2;
  int iVar3;
  
  __ptr = (ibuf->fds).tqh_first;
  if (__ptr == (imsg_fd *)0x0) {
    iVar3 = -1;
  }
  else {
    iVar3 = __ptr->fd;
    piVar1 = (imsgbuf *)(__ptr->entry).tqe_next;
    ppiVar2 = (__ptr->entry).tqe_prev;
    if (piVar1 != (imsgbuf *)0x0) {
      ibuf = piVar1;
    }
    (ibuf->fds).tqh_last = ppiVar2;
    *ppiVar2 = (imsg_fd *)piVar1;
    free(__ptr);
  }
  return iVar3;
}

Assistant:

int
imsg_get_fd(struct imsgbuf *ibuf)
{
	int		 fd;
	struct imsg_fd	*ifd;

	if ((ifd = TAILQ_FIRST(&ibuf->fds)) == NULL)
		return (-1);

	fd = ifd->fd;
	TAILQ_REMOVE(&ibuf->fds, ifd, entry);
	free(ifd);

	return (fd);
}